

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::SubtractPropagateStatistics::Operation<long,duckdb::TryDecimalSubtract>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  long value;
  long lVar2;
  long lVar3;
  Value local_70;
  
  value = NumericStats::GetMin<long>(lstats);
  lVar2 = NumericStats::GetMax<long>(rstats);
  if (lVar2 < 0) {
    if (lVar2 + 999999999999999999 < value) goto LAB_014812dc;
LAB_014812f2:
    value = value - lVar2;
    bVar1 = true;
  }
  else {
    if (lVar2 + -999999999999999999 <= value) goto LAB_014812f2;
LAB_014812dc:
    bVar1 = false;
  }
  if (!bVar1) {
    return true;
  }
  lVar2 = NumericStats::GetMax<long>(lstats);
  lVar3 = NumericStats::GetMin<long>(rstats);
  if (lVar3 < 0) {
    if (lVar3 + 999999999999999999 < lVar2) goto LAB_0148132c;
  }
  else if (lVar2 < lVar3 + -999999999999999999) {
LAB_0148132c:
    bVar1 = false;
    goto LAB_01481347;
  }
  lVar2 = lVar2 - lVar3;
  bVar1 = true;
LAB_01481347:
  if (bVar1) {
    Value::Numeric(&local_70,type,value);
    Value::operator=(new_min,&local_70);
    Value::~Value(&local_70);
    Value::Numeric(&local_70,type,lVar2);
    Value::operator=(new_max,&local_70);
    Value::~Value(&local_70);
  }
  return !bVar1;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(rstats), min)) {
			return true;
		}
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMin<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}